

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O1

void __thiscall vera::Vbo::addVertices(Vbo *this,GLbyte *_vertices,int _nVertices)

{
  if (this->m_isUploaded == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Vbo cannot add vertices after upload!",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    return;
  }
  std::vector<signed_char,std::allocator<signed_char>>::_M_range_insert<signed_char*>
            ((vector<signed_char,std::allocator<signed_char>> *)&this->m_vertexData,
             (this->m_vertexData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,_vertices,
             _vertices + (long)this->m_vertexLayout->m_stride * (long)_nVertices);
  this->m_nVertices = this->m_nVertices + _nVertices;
  return;
}

Assistant:

void Vbo::addVertices(GLbyte* _vertices, int _nVertices) {
    if (m_isUploaded) {
        std::cout << "Vbo cannot add vertices after upload!" << std::endl;
        return;
    }

    // // Only add up to 65535 vertices, any more will overflow our 16-bit indices
    // int indexSpace = MAX_INDEX_VALUE - m_nVertices;
    // if (_nVertices > indexSpace) {
    //     _nVertices = indexSpace;
    //     std::cout << "WARNING: Tried to add more vertices than available in index space" << std::endl;
    // }

    int vertexBytes = m_vertexLayout->getStride() * _nVertices;
    m_vertexData.insert(m_vertexData.end(), _vertices, _vertices + vertexBytes);
    m_nVertices += _nVertices;
}